

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O0

int jp2_bpcc_putdata(jp2_box_t *box,jas_stream_t *out)

{
  int iVar1;
  uint local_2c;
  uint i;
  jp2_bpcc_t *bpcc;
  jas_stream_t *out_local;
  jp2_box_t *box_local;
  
  local_2c = 0;
  while( true ) {
    if ((box->data).ftyp.majver <= (ulong)local_2c) {
      return 0;
    }
    iVar1 = jp2_putuint8(out,(box->data).bpcc.bpcs[local_2c]);
    if (iVar1 != 0) break;
    local_2c = local_2c + 1;
  }
  return -1;
}

Assistant:

static int jp2_bpcc_putdata(jp2_box_t *box, jas_stream_t *out)
{
	jp2_bpcc_t *bpcc = &box->data.bpcc;
	unsigned int i;
	for (i = 0; i < bpcc->numcmpts; ++i) {
		if (jp2_putuint8(out, bpcc->bpcs[i])) {
			return -1;
		}
	}
	return 0;
}